

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O1

aiMaterial * __thiscall Assimp::IrrlichtBase::ParseMaterial(IrrlichtBase *this,uint *matFlags)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  int iVar3;
  aiMaterial *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Logger *pLVar4;
  char *pKey;
  uint uVar5;
  uint index;
  float fVar6;
  float f;
  int op;
  aiString s;
  int local_4c4;
  StringProperty local_4c0;
  ulong local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined8 local_458;
  undefined8 uStack_450;
  uint *local_440;
  aiString local_434;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_458 = 0;
  uStack_450 = 0;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  *matFlags = 0;
  iVar3 = (*this->reader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar3 != '\0') {
    local_480 = 0;
    local_4c4 = 0;
    do {
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        if ((char *)CONCAT44(extraout_var_01,iVar3) == (char *)0x0) {
LAB_00422242:
          __assert_fail("__null != s1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                        ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        iVar3 = strcasecmp((char *)CONCAT44(extraout_var_01,iVar3),"color");
        if (iVar3 == 0) {
          local_4c0.name._M_dataplus._M_p = (pointer)&local_4c0.name.field_2;
          local_4c0.name._M_string_length = 0;
          local_4c0.name.field_2._M_local_buf[0] = '\0';
          ReadHexProperty(this,(HexProperty *)&local_4c0);
          iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
          if (iVar3 == 0) {
            uStack_450._4_4_ = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x18) / 255.0;
            fVar6 = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x10 & 0xff) / 255.0;
            pKey = "$clr.diffuse";
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            if (iVar3 == 0) {
              uStack_450._4_4_ = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x18) / 255.0;
              fVar6 = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x10 & 0xff) / 255.0;
              pKey = "$clr.ambient";
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
              if (iVar3 != 0) goto LAB_004220f7;
              uStack_450._4_4_ = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x18) / 255.0;
              fVar6 = (float)((uint)local_4c0.value._M_dataplus._M_p >> 0x10 & 0xff) / 255.0;
              pKey = "$clr.specular";
            }
          }
          local_458 = CONCAT44((float)((uint)local_4c0.value._M_dataplus._M_p >> 8 & 0xff) / 255.0,
                               fVar6);
          uStack_450 = CONCAT44(uStack_450._4_4_,
                                (float)((uint)local_4c0.value._M_dataplus._M_p & 0xff) / 255.0);
          aiMaterial::AddBinaryProperty(this_00,&local_458,0x10,pKey,0,0,aiPTI_Float);
        }
        else {
          iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
          if ((char *)CONCAT44(extraout_var_02,iVar3) == (char *)0x0) goto LAB_00422242;
          iVar3 = strcasecmp((char *)CONCAT44(extraout_var_02,iVar3),"float");
          if (iVar3 == 0) {
            local_4c0.name._M_dataplus._M_p = (pointer)&local_4c0.name.field_2;
            local_4c0.name._M_string_length = 0;
            local_4c0.name.field_2._M_local_buf[0] = '\0';
            ReadFloatProperty(this,(FloatProperty *)&local_4c0);
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            if (iVar3 == 0) {
              aiMaterial::AddBinaryProperty
                        (this_00,&local_4c0.value,4,"$mat.shininess",0,0,aiPTI_Float);
            }
            goto LAB_004220f7;
          }
          iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
          if ((char *)CONCAT44(extraout_var_03,iVar3) == (char *)0x0) goto LAB_00422242;
          iVar3 = strcasecmp((char *)CONCAT44(extraout_var_03,iVar3),"bool");
          if (iVar3 == 0) {
            local_4c0.name._M_dataplus._M_p = (pointer)&local_4c0.name.field_2;
            local_4c0.name._M_string_length = 0;
            local_4c0.name.field_2._M_local_buf[0] = '\0';
            ReadBoolProperty(this,(BoolProperty *)&local_4c0);
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            if (iVar3 == 0) {
              local_478._M_dataplus._M_p._0_4_ = (uint)(byte)local_4c0.value._M_dataplus._M_p;
              aiMaterial::AddBinaryProperty(this_00,&local_478,4,"$mat.wireframe",0,0,aiPTI_Integer)
              ;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
              if (iVar3 == 0) {
                local_478._M_dataplus._M_p._0_4_ = 9;
                if ((byte)local_4c0.value._M_dataplus._M_p != '\0') {
                  local_478._M_dataplus._M_p._0_4_ = 2;
                }
                aiMaterial::AddBinaryProperty
                          (this_00,&local_478,4,"$mat.shadingm",0,0,aiPTI_Integer);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
                if (iVar3 == 0) {
                  local_478._M_dataplus._M_p._0_4_ = (byte)local_4c0.value._M_dataplus._M_p ^ 1;
                  aiMaterial::AddBinaryProperty
                            (this_00,&local_478,4,"$mat.twosided",0,0,aiPTI_Integer);
                }
              }
            }
            goto LAB_004220f7;
          }
          iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
          if ((char *)CONCAT44(extraout_var_04,iVar3) == (char *)0x0) goto LAB_00422242;
          iVar3 = strcasecmp((char *)CONCAT44(extraout_var_04,iVar3),"texture");
          if (iVar3 != 0) {
            iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
            if ((char *)CONCAT44(extraout_var_05,iVar3) == (char *)0x0) goto LAB_00422242;
            iVar3 = strcasecmp((char *)CONCAT44(extraout_var_05,iVar3),"enum");
            if (iVar3 != 0) goto LAB_0042210b;
          }
          local_4c0.name._M_dataplus._M_p = (pointer)&local_4c0.name.field_2;
          local_4c0.name._M_string_length = 0;
          local_4c0.name.field_2._M_local_buf[0] = '\0';
          local_4c0.value._M_dataplus._M_p = (pointer)&local_4c0.value.field_2;
          local_4c0.value._M_string_length = 0;
          local_4c0.value.field_2._M_local_buf[0] = '\0';
          ReadStringProperty(this,&local_4c0);
          if (local_4c0.value._M_string_length != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            if ((iVar3 == 0) &&
               (iVar3 = std::__cxx11::string::compare((char *)&local_4c0.value), iVar3 != 0)) {
              pbVar1 = &local_4c0.value;
              iVar3 = std::__cxx11::string::compare((char *)pbVar1);
              if (iVar3 == 0) {
                *matFlags = 1;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                if (iVar3 == 0) {
                  *matFlags = 2;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                  if (iVar3 == 0) {
                    *matFlags = 0x10000;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                    if (iVar3 == 0) {
                      *matFlags = 6;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                      if (iVar3 == 0) {
                        *matFlags = 10;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                        if (iVar3 == 0) {
                          *matFlags = 0x12;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                          if (iVar3 == 0) {
                            *matFlags = 0x22;
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                            if (iVar3 == 0) {
                              *matFlags = 0x42;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                              if (iVar3 == 0) {
                                *matFlags = 0x82;
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                                if ((iVar3 == 0) ||
                                   (iVar3 = std::__cxx11::string::compare((char *)pbVar1),
                                   iVar3 == 0)) {
                                  *matFlags = 0x100;
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                                  if ((iVar3 == 0) ||
                                     (iVar3 = std::__cxx11::string::compare((char *)pbVar1),
                                     iVar3 == 0)) {
                                    *matFlags = 0x101;
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
                                    if ((iVar3 == 0) ||
                                       (iVar3 = std::__cxx11::string::compare
                                                          ((char *)&local_4c0.value), iVar3 == 0)) {
                                      *matFlags = 0x102;
                                    }
                                    else {
                                      pLVar4 = DefaultLogger::get();
                                      std::operator+(&local_478,
                                                     "IRRMat: Unrecognized material type: ",
                                                     &local_4c0.value);
                                      Logger::warn(pLVar4,(char *)CONCAT44(local_478._M_dataplus.
                                                                           _M_p._4_4_,
                                                                           (uint)local_478.
                                                                                 _M_dataplus._M_p));
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(local_478._M_dataplus._M_p._4_4_,
                                                      (uint)local_478._M_dataplus._M_p) !=
                                          &local_478.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT44(local_478._M_dataplus._M_p._4_4_,
                                                                 (uint)local_478._M_dataplus._M_p));
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            sVar2 = local_4c0.value._M_string_length;
            if (iVar3 == 0) {
              if (local_4c0.value._M_string_length < 0x400) {
                local_434.length = (ai_uint32)local_4c0.value._M_string_length;
                memcpy(local_434.data,local_4c0.value._M_dataplus._M_p,
                       local_4c0.value._M_string_length);
                local_434.data[sVar2] = '\0';
              }
              aiMaterial::AddProperty(this_00,&local_434,"$tex.file",1,0);
              local_4c4 = local_4c4 + 1;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
              sVar2 = local_4c0.value._M_string_length;
              if ((iVar3 == 0) && (local_4c4 == 1)) {
                uVar5 = *matFlags;
                if ((uVar5 & 2) == 0) {
                  if ((uVar5 >> 8 & 1) != 0) {
                    uVar5 = 6;
                    goto LAB_00421dc5;
                  }
                  if ((uVar5 >> 0x10 & 1) == 0) {
                    pLVar4 = DefaultLogger::get();
                    local_4c4 = 1;
                    Logger::warn(pLVar4,"IRRmat: Skipping second texture");
                    goto LAB_00421e1f;
                  }
                  if (local_4c0.value._M_string_length < 0x400) {
                    local_434.length = (ai_uint32)local_4c0.value._M_string_length;
                    memcpy(local_434.data,local_4c0.value._M_dataplus._M_p,
                           local_4c0.value._M_string_length);
                    local_434.data[sVar2] = '\0';
                  }
                  aiMaterial::AddProperty(this_00,&local_434,"$tex.file",1,1);
                  local_480 = (ulong)((int)local_480 + 1);
                }
                else {
                  uVar5 = 10;
LAB_00421dc5:
                  if (local_4c0.value._M_string_length < 0x400) {
                    local_434.length = (ai_uint32)local_4c0.value._M_string_length;
                    memcpy(local_434.data,local_4c0.value._M_dataplus._M_p,
                           local_4c0.value._M_string_length);
                    local_434.data[sVar2] = '\0';
                  }
                  aiMaterial::AddProperty(this_00,&local_434,"$tex.file",uVar5,0);
                }
                *(byte *)((long)matFlags + 2) = *(byte *)((long)matFlags + 2) | 0x10;
                local_4c4 = 2;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
                sVar2 = local_4c0.value._M_string_length;
                if ((iVar3 == 0) && (local_4c4 == 2)) {
                  if (local_4c0.value._M_string_length < 0x400) {
                    local_434.length = (ai_uint32)local_4c0.value._M_string_length;
                    memcpy(local_434.data,local_4c0.value._M_dataplus._M_p,
                           local_4c0.value._M_string_length);
                    local_434.data[sVar2] = '\0';
                  }
                  local_4c4 = 3;
                  aiMaterial::AddProperty(this_00,&local_434,"$tex.file",1,(int)local_480 + 1);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
                  sVar2 = local_4c0.value._M_string_length;
                  if ((iVar3 == 0) && (local_4c4 == 3)) {
                    if (local_4c0.value._M_string_length < 0x400) {
                      local_434.length = (ai_uint32)local_4c0.value._M_string_length;
                      memcpy(local_434.data,local_4c0.value._M_dataplus._M_p,
                             local_4c0.value._M_string_length);
                      local_434.data[sVar2] = '\0';
                    }
                    local_4c4 = 4;
                    aiMaterial::AddProperty(this_00,&local_434,"$tex.file",1,(int)local_480 + 2);
                  }
                }
              }
            }
LAB_00421e1f:
            iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
            if ((iVar3 == 0) && (0 < local_4c4)) {
              local_478._M_dataplus._M_p._0_4_ = ConvertMappingMode(&local_4c0.value);
              aiMaterial::AddBinaryProperty(this_00,&local_478,4,"$tex.mapmodeu",1,0,aiPTI_Integer);
              aiMaterial::AddBinaryProperty(this_00,&local_478,4,"$tex.mapmodev",1,0,aiPTI_Integer);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
              if ((iVar3 == 0) && (1 < local_4c4)) {
                local_478._M_dataplus._M_p._0_4_ = ConvertMappingMode(&local_4c0.value);
                uVar5 = *matFlags;
                local_440 = matFlags;
                if ((uVar5 & 2) == 0) {
                  if ((uVar5 >> 8 & 1) == 0) {
                    if ((uVar5 >> 0x10 & 1) == 0) goto LAB_004220e3;
                    uVar5 = 1;
                    aiMaterial::AddBinaryProperty
                              (this_00,&local_478,4,"$tex.mapmodeu",1,1,aiPTI_Integer);
                    index = 1;
                  }
                  else {
                    index = 0;
                    uVar5 = 6;
                    aiMaterial::AddBinaryProperty
                              (this_00,&local_478,4,"$tex.mapmodeu",6,0,aiPTI_Integer);
                  }
                }
                else {
                  index = 0;
                  uVar5 = 10;
                  aiMaterial::AddBinaryProperty
                            (this_00,&local_478,4,"$tex.mapmodeu",10,0,aiPTI_Integer);
                }
                aiMaterial::AddBinaryProperty
                          (this_00,&local_478,4,"$tex.mapmodev",uVar5,index,aiPTI_Integer);
                matFlags = local_440;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
                if ((iVar3 == 0) && (2 < local_4c4)) {
                  local_478._M_dataplus._M_p._0_4_ = ConvertMappingMode(&local_4c0.value);
                  uVar5 = (int)local_480 + 1;
                  aiMaterial::AddBinaryProperty
                            (this_00,&local_478,4,"$tex.mapmodeu",1,uVar5,aiPTI_Integer);
                  aiMaterial::AddBinaryProperty
                            (this_00,&local_478,4,"$tex.mapmodev",1,uVar5,aiPTI_Integer);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&local_4c0);
                  if ((iVar3 == 0) && (3 < local_4c4)) {
                    local_478._M_dataplus._M_p._0_4_ = ConvertMappingMode(&local_4c0.value);
                    uVar5 = (int)local_480 + 2;
                    aiMaterial::AddBinaryProperty
                              (this_00,&local_478,4,"$tex.mapmodeu",1,uVar5,aiPTI_Integer);
                    aiMaterial::AddBinaryProperty
                              (this_00,&local_478,4,"$tex.mapmodev",1,uVar5,aiPTI_Integer);
                  }
                }
              }
            }
          }
LAB_004220e3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0.value._M_dataplus._M_p != &local_4c0.value.field_2) {
            operator_delete(local_4c0.value._M_dataplus._M_p);
          }
        }
LAB_004220f7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0.name._M_dataplus._M_p != &local_4c0.name.field_2) {
          operator_delete(local_4c0.name._M_dataplus._M_p);
        }
      }
      else if (iVar3 == 2) {
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        if ((char *)CONCAT44(extraout_var,iVar3) == (char *)0x0) goto LAB_00422242;
        iVar3 = strcasecmp((char *)CONCAT44(extraout_var,iVar3),"material");
        if (iVar3 == 0) {
LAB_004221ae:
          if (local_4c4 == 0) {
            return this_00;
          }
          uVar5 = *matFlags;
          if ((uVar5 & 2) == 0) {
            return this_00;
          }
          local_4c0.name._M_dataplus._M_p._0_4_ = 0x3f800000;
          local_478._M_dataplus._M_p._0_4_ = uVar5 >> 7 & 1;
          if ((uVar5 & 0x24) == 0) {
            if ((uVar5 & 0x48) != 0) {
              local_4c0.name._M_dataplus._M_p._0_4_ = 0x40800000;
            }
          }
          else {
            local_4c0.name._M_dataplus._M_p._0_4_ = 0x40000000;
          }
          aiMaterial::AddBinaryProperty(this_00,&local_4c0,4,"$tex.blend",10,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty(this_00,&local_478,4,"$tex.op",10,0,aiPTI_Integer);
          return this_00;
        }
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        if ((char *)CONCAT44(extraout_var_00,iVar3) == (char *)0x0) goto LAB_00422242;
        iVar3 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar3),"attributes");
        if (iVar3 == 0) goto LAB_004221ae;
      }
LAB_0042210b:
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  pLVar4 = DefaultLogger::get();
  Logger::error(pLVar4,"IRRMESH: Unexpected end of file. Material is not complete");
  return this_00;
}

Assistant:

aiMaterial* IrrlichtBase::ParseMaterial(unsigned int& matFlags)
{
    aiMaterial* mat = new aiMaterial();
    aiColor4D clr;
    aiString s;

    matFlags = 0; // zero output flags
    int cnt  = 0; // number of used texture channels
    unsigned int nd = 0;

    // Continue reading from the file
    while (reader->read())
    {
        switch (reader->getNodeType())
        {
        case EXN_ELEMENT:

            // Hex properties
            if (!ASSIMP_stricmp(reader->getNodeName(),"color"))
            {
                HexProperty prop;
                ReadHexProperty(prop);
                if (prop.name == "Diffuse")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
                }
                else if (prop.name == "Ambient")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);
                }
                else if (prop.name == "Specular")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
                }

                // NOTE: The 'emissive' property causes problems. It is
                // often != 0, even if there is obviously no light
                // emitted by the described surface. In fact I think
                // IRRLICHT ignores this property, too.
#if 0
                else if (prop.name == "Emissive")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_EMISSIVE);
                }
#endif
            }
            // Float properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"float"))
            {
                FloatProperty prop;
                ReadFloatProperty(prop);
                if (prop.name == "Shininess")
                {
                    mat->AddProperty(&prop.value,1,AI_MATKEY_SHININESS);
                }
            }
            // Bool properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"bool"))
            {
                BoolProperty prop;
                ReadBoolProperty(prop);
                if (prop.name == "Wireframe")
                {
                    int val = (prop.value ? true : false);
                    mat->AddProperty(&val,1,AI_MATKEY_ENABLE_WIREFRAME);
                }
                else if (prop.name == "GouraudShading")
                {
                    int val = (prop.value ? aiShadingMode_Gouraud
                        : aiShadingMode_NoShading);
                    mat->AddProperty(&val,1,AI_MATKEY_SHADING_MODEL);
                }
                else if (prop.name == "BackfaceCulling")
                {
                    int val = (!prop.value);
                    mat->AddProperty(&val,1,AI_MATKEY_TWOSIDED);
                }
            }
            // String properties - textures and texture related properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"texture") ||
                     !ASSIMP_stricmp(reader->getNodeName(),"enum"))
            {
                StringProperty prop;
                ReadStringProperty(prop);
                if (prop.value.length())
                {
                    // material type (shader)
                    if (prop.name == "Type")
                    {
                        if (prop.value == "solid")
                        {
                            // default material ...
                        }
                        else if (prop.value == "trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_trans_vertex_alpha;
                        }
                        else if (prop.value == "lightmap")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap;
                        }
                        else if (prop.value == "solid_2layer")
                        {
                            matFlags = AI_IRRMESH_MAT_solid_2layer;
                        }
                        else if (prop.value == "lightmap_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m2;
                        }
                        else if (prop.value == "lightmap_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m4;
                        }
                        else if (prop.value == "lightmap_light")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light;
                        }
                        else if (prop.value == "lightmap_light_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m2;
                        }
                        else if (prop.value == "lightmap_light_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m4;
                        }
                        else if (prop.value == "lightmap_add")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_add;
                        }
                        // Normal and parallax maps are treated equally
                        else if (prop.value == "normalmap_solid" ||
                            prop.value == "parallaxmap_solid")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_solid;
                        }
                        else if (prop.value == "normalmap_trans_vertex_alpha" ||
                            prop.value == "parallaxmap_trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_tva;
                        }
                        else if (prop.value == "normalmap_trans_add" ||
                            prop.value == "parallaxmap_trans_add")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_ta;
                        }
                        else {
                            ASSIMP_LOG_WARN("IRRMat: Unrecognized material type: " + prop.value);
                        }
                    }

                    // Up to 4 texture channels are supported
                    if (prop.name == "Texture1")
                    {
                        // Always accept the primary texture channel
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                    }
                    else if (prop.name == "Texture2" && cnt == 1)
                    {
                        // 2-layer material lightmapped?
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_LIGHTMAP(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        }
                        // alternatively: normal or parallax mapping
                        else if (matFlags & AI_IRRMESH_MAT_normalmap_solid) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_NORMALS(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else if (matFlags & AI_IRRMESH_MAT_solid_2layer)    {// or just as second diffuse texture
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(1));
                            ++nd;

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else {
                            ASSIMP_LOG_WARN("IRRmat: Skipping second texture");
                        }
                    } else if (prop.name == "Texture3" && cnt == 2) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+1));
                    } else if (prop.name == "Texture4" && cnt == 3) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+2));
                    }

                    // Texture mapping options
                    if (prop.name == "TextureWrap1" && cnt >= 1)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
                    }
                    else if (prop.name == "TextureWrap2" && cnt >= 2)
                    {
                        int map = ConvertMappingMode(prop.value);
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_LIGHTMAP(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_LIGHTMAP(0));
                        }
                        else if (matFlags & (AI_IRRMESH_MAT_normalmap_solid)) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_NORMALS(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_NORMALS(0));
                        }
                        else if (matFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(1));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(1));
                        }
                    }
                    else if (prop.name == "TextureWrap3" && cnt >= 3)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+1));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+1));
                    }
                    else if (prop.name == "TextureWrap4" && cnt >= 4)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+2));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+2));
                    }
                }
            }
            break;
            case EXN_ELEMENT_END:

                /* Assume there are no further nested nodes in <material> elements
                 */
                if (/* IRRMESH */ !ASSIMP_stricmp(reader->getNodeName(),"material") ||
                    /* IRR     */ !ASSIMP_stricmp(reader->getNodeName(),"attributes"))
                {
                    // Now process lightmapping flags
                    // We should have at least one textur to do that ..
                    if (cnt && matFlags & AI_IRRMESH_MAT_lightmap)
                    {
                        float f = 1.f;
                        unsigned int unmasked = matFlags&~AI_IRRMESH_MAT_lightmap;

                        // Additive lightmap?
                        int op = (unmasked & AI_IRRMESH_MAT_lightmap_add
                            ? aiTextureOp_Add : aiTextureOp_Multiply);

                        // Handle Irrlicht's lightmapping scaling factor
                        if (unmasked & AI_IRRMESH_MAT_lightmap_m2 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m2)
                        {
                            f = 2.f;
                        }
                        else if (unmasked & AI_IRRMESH_MAT_lightmap_m4 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m4)
                        {
                            f = 4.f;
                        }
                        mat->AddProperty( &f, 1, AI_MATKEY_TEXBLEND_LIGHTMAP(0));
                        mat->AddProperty( &op,1, AI_MATKEY_TEXOP_LIGHTMAP(0));
                    }

                    return mat;
                }
            default:

                // GCC complains here ...
                break;
        }
    }
    ASSIMP_LOG_ERROR("IRRMESH: Unexpected end of file. Material is not complete");

    return mat;
}